

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void __thiscall ExampleAppLog::Clear(ExampleAppLog *this)

{
  int iVar1;
  char *ptr;
  int *piVar2;
  int iVar3;
  int *__dest;
  int iVar4;
  
  ptr = (this->Buf).Buf.Data;
  if (ptr != (char *)0x0) {
    (this->Buf).Buf.Size = 0;
    (this->Buf).Buf.Capacity = 0;
    ImGui::MemFree(ptr);
    (this->Buf).Buf.Data = (char *)0x0;
  }
  piVar2 = (this->LineOffsets).Data;
  if (piVar2 != (int *)0x0) {
    (this->LineOffsets).Size = 0;
    (this->LineOffsets).Capacity = 0;
    ImGui::MemFree(piVar2);
    (this->LineOffsets).Data = (int *)0x0;
  }
  iVar1 = (this->LineOffsets).Size;
  if (iVar1 == 0) {
    iVar3 = 8;
  }
  else {
    iVar3 = iVar1 / 2 + iVar1;
  }
  iVar4 = iVar1 + 1;
  if (iVar1 + 1 < iVar3) {
    iVar4 = iVar3;
  }
  __dest = (int *)ImGui::MemAlloc((long)iVar4 << 2);
  piVar2 = (this->LineOffsets).Data;
  if (piVar2 != (int *)0x0) {
    memcpy(__dest,piVar2,(long)(this->LineOffsets).Size << 2);
    ImGui::MemFree((this->LineOffsets).Data);
  }
  (this->LineOffsets).Data = __dest;
  (this->LineOffsets).Capacity = iVar4;
  __dest[(this->LineOffsets).Size] = 0;
  (this->LineOffsets).Size = (this->LineOffsets).Size + 1;
  return;
}

Assistant:

void    Clear()
    {
        Buf.clear();
        LineOffsets.clear();
        LineOffsets.push_back(0);
    }